

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpcfgs.cpp
# Opt level: O2

StrategyConfig * readoptions(StrategyConfig *__return_storage_ptr__,int argc,char **argv)

{
  char **ppcVar1;
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  istream *piVar7;
  unsigned_long uVar8;
  char *pcVar9;
  pointer pcVar10;
  pointer pcVar11;
  ostream *poVar12;
  undefined8 uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  string *this_00;
  char *pcVar15;
  char *pcVar16;
  value_type local_478 [2];
  _List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_458;
  string line;
  uint auStack_418 [120];
  ifstream input;
  
  std::ifstream::ifstream(&input);
  local_458._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_458;
  local_458._M_impl._M_node._M_size = 0;
  local_458._M_impl._M_node.super__List_node_base._M_prev =
       local_458._M_impl._M_node.super__List_node_base._M_next;
  StrategyConfig::StrategyConfig
            (__return_storage_ptr__,false,false,false,false,
             (list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)local_458._M_impl._M_node.super__List_node_base._M_next,(char *)0x0,(char *)0x0,
             (char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::
  _List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_clear(&local_458);
  this = &__return_storage_ptr__->ranges;
  do {
    iVar6 = getopt(argc,argv,":cps:br:a:A:i:o:d:");
    pcVar9 = _optarg;
    switch(iVar6) {
    case 0x61:
      iVar6 = strncasecmp(_optarg,"0x",2);
      if (iVar6 != 0) {
        pcVar9 = pcVar9 + 2;
        _optarg = pcVar9;
      }
      std::__cxx11::string::string((string *)&line,pcVar9,(allocator *)local_478);
      pcVar10 = (pointer)std::__cxx11::stoul(&line,(size_t *)0x0,0x10);
      std::__cxx11::string::~string((string *)&line);
      if (pcVar10 != (pointer)0x0) {
        line._M_dataplus._M_p = pcVar10;
        line._M_string_length = (size_type)pcVar10;
        std::__cxx11::
        list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back(this,(value_type *)&line);
      }
      break;
    case 0x62:
      __return_storage_ptr__->both = true;
      break;
    case 99:
      __return_storage_ptr__->compress = true;
      break;
    case 100:
      __return_storage_ptr__->dump = _optarg;
      break;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x71:
switchD_0010e5c8_caseD_65:
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&line,"Invalid option: ",(allocator *)local_478);
      std::operator+(pbVar14,&line,optopt);
      __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    case 0x69:
      __return_storage_ptr__->instrs = _optarg;
      break;
    case 0x6f:
      __return_storage_ptr__->output = _optarg;
      break;
    case 0x70:
      __return_storage_ptr__->detailed = true;
      break;
    case 0x72:
      pcVar9 = strchr(_optarg,0x3a);
      if (pcVar9 == (char *)0x0) {
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&line,"invalid range: ",(allocator *)local_478);
        std::operator+(pbVar14,&line,_optarg);
        __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      *pcVar9 = '\0';
      pcVar15 = _optarg;
      iVar6 = strncasecmp(_optarg,"0x",2);
      if (iVar6 != 0) {
        pcVar15 = pcVar15 + 2;
        _optarg = pcVar15;
      }
      iVar6 = strncasecmp(pcVar9 + 1,"0x",2);
      pcVar16 = pcVar9 + 3;
      if (iVar6 == 0) {
        pcVar16 = pcVar9 + 1;
      }
      std::__cxx11::string::string((string *)&line,pcVar15,(allocator *)local_478);
      pcVar10 = (pointer)std::__cxx11::stoul(&line,(size_t *)0x0,0x10);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::string((string *)&line,pcVar16,(allocator *)local_478);
      pcVar11 = (pointer)std::__cxx11::stoul(&line,(size_t *)0x0,0x10);
      std::__cxx11::string::~string((string *)&line);
      if (pcVar11 < pcVar10) {
        std::__cxx11::stringstream::stringstream((stringstream *)&line);
        lVar2 = *(long *)(CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                   line.field_2._M_local_buf[0]) + -0x18);
        *(uint *)((long)auStack_418 + lVar2) = *(uint *)((long)auStack_418 + lVar2) & 0xffffffb5 | 8
        ;
        poVar12 = std::operator<<((ostream *)line.field_2._M_local_buf,"invalid range: ");
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        poVar12 = std::operator<<(poVar12," < ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        uVar13 = __cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        __cxa_throw(uVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      line._M_dataplus._M_p = pcVar10;
      line._M_string_length = (size_type)pcVar11;
      std::__cxx11::
      list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back(this,(value_type *)&line);
      break;
    case 0x73:
      iVar6 = strcasecmp(_optarg,"simple");
      if (iVar6 == 0) {
        __return_storage_ptr__->specific = false;
      }
      else {
        iVar6 = strcasecmp(pcVar9,"specific");
        if (iVar6 != 0) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          std::__cxx11::string::string((string *)&line,"Invalid strategy: ",(allocator *)local_478);
          std::operator+(pbVar14,&line,_optarg);
          __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        __return_storage_ptr__->specific = true;
      }
      break;
    default:
      if (iVar6 != 0x41) {
        if (iVar6 == -1) {
          if (_optind + 1 < argc) {
            iVar6 = _optind + 2;
            ppcVar1 = argv + _optind;
            uVar3 = *(undefined4 *)((long)ppcVar1 + 4);
            uVar4 = *(undefined4 *)(ppcVar1 + 1);
            uVar5 = *(undefined4 *)((long)ppcVar1 + 0xc);
            _optind = iVar6;
            *(undefined4 *)&__return_storage_ptr__->input1 = *(undefined4 *)ppcVar1;
            *(undefined4 *)((long)&__return_storage_ptr__->input1 + 4) = uVar3;
            *(undefined4 *)&__return_storage_ptr__->input2 = uVar4;
            *(undefined4 *)((long)&__return_storage_ptr__->input2 + 4) = uVar5;
            if (argc <= iVar6) {
              if ((__return_storage_ptr__->both == false) &&
                 (__return_storage_ptr__->specific == true)) {
                this_00 = (string *)__cxa_allocate_exception(0x20);
                std::__cxx11::string::string
                          (this_00,"-b must be used with specific strategy",(allocator *)&line);
                __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              std::ifstream::~ifstream(&input);
              return __return_storage_ptr__;
            }
          }
          else {
            usage(*argv);
          }
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    ((string *)&line,"Unknown extra option: ",(allocator *)local_478);
          std::operator+(pbVar14,&line,argv[_optind]);
          __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        goto switchD_0010e5c8_caseD_65;
      }
      std::ifstream::ifstream(&line,_optarg,_S_in);
      std::ifstream::operator=((istream *)&input,(ifstream *)&line);
      std::ifstream::~ifstream(&line);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&input,(string *)&line),
            ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
        trim(&line);
        if ((1 < line._M_string_length) &&
           (iVar6 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x2), iVar6 != 0)) {
          std::__cxx11::string::substr((ulong)local_478,(ulong)&line);
          std::__cxx11::string::operator=((string *)&line,(string *)local_478);
          std::__cxx11::string::~string((string *)local_478);
        }
        if ((line._M_string_length != 0) &&
           (uVar8 = std::__cxx11::stoul(&line,(size_t *)0x0,0x10), uVar8 != 0)) {
          local_478[0].first = uVar8;
          local_478[0].second = uVar8;
          std::__cxx11::
          list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::push_back(this,local_478);
        }
      }
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::close();
    }
  } while( true );
}

Assistant:

StrategyConfig readoptions(int argc, char* argv[]) {
	int opt;
	char* idx;
	Addr start, end;
	std::ifstream input;
	StrategyConfig config;

	while ((opt = getopt(argc, argv, ":cps:br:a:A:i:o:d:")) != -1) {
		switch (opt) {
			case 'c':
				config.compress = true;
				break;
			case 'p':
				config.detailed = true;
				break;
			case 's':
				if (strcasecmp(optarg, "simple") == 0)
					config.specific = false;
				else if (strcasecmp(optarg, "specific") == 0)
					config.specific = true;
				else
					throw std::string("Invalid strategy: ") + optarg;
				break;
			case 'b':
				config.both = true;
				break;
			case 'r':
				idx = strchr(optarg, ':');
				if (!idx)
					throw std::string("invalid range: ") + optarg;

				*idx = 0;
				idx++;

				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;
				if (strncasecmp(idx, "0x", 2))
					idx += 2;

				start = std::stoul(optarg, 0, 16);
				end = std::stoul(idx, 0, 16);

				if (end < start) {
					std::stringstream ss;
					ss << std::hex;
					ss << "invalid range: " << end << " < " << start;

					throw ss.str();
				}

				config.ranges.push_back(std::make_pair(start, end));
				break;
			case 'a':
				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;

				start = std::stoul(optarg, 0, 16);
				if (start != 0)
					config.ranges.push_back(std::make_pair(start, start));
				break;
			case 'A':
				input = std::ifstream(optarg);
				for (std::string line; getline(input, line); ) {
					trim(line);

					if (line.length() >= 2 && line.compare(0, 2, "0x"))
						line = line.substr(2);

					if (line.empty())
						continue;

					start = std::stoul(line, 0, 16);
					if (start != 0)
						config.ranges.push_back(std::make_pair(start, start));
				}
				input.close();

				break;
			case 'i':
				config.instrs = optarg;
				break;
			case 'o':
				config.output = optarg;
				break;
			case 'd':
				config.dump = optarg;
				break;
			default:
				throw std::string("Invalid option: ") + (char) optopt;
		}
	}

	if (optind+1 >= argc)
		usage(argv[0]);

	config.input1 = argv[optind++];
	config.input2 = argv[optind++];

	if (optind < argc)
		throw std::string("Unknown extra option: ") + argv[optind];

	if (!config.both && config.specific)
		throw std::string("-b must be used with specific strategy");

	return config;
}